

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
VulkanHppGenerator::generateEnumSuffixes
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this,string *name,bool bitmask)

{
  _Rb_tree_node_base *__lhs;
  bool bVar1;
  size_type __pos;
  _Base_ptr p_Var2;
  string *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string shortenedName;
  string prefix;
  string tag;
  string local_b0;
  string postfix;
  string local_70;
  string local_50;
  
  this_00 = &shortenedName;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  postfix._M_dataplus._M_p = (pointer)&postfix.field_2;
  postfix._M_string_length = 0;
  postfix.field_2._M_local_buf[0] = '\0';
  bVar1 = std::operator==(name,"VkResult");
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&prefix,"VK_");
  }
  else {
    if (bitmask) {
      __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (name,"FlagBits",0);
      if (__pos == 0xffffffffffffffff) {
        __assert_fail("pos != std::string::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x1d1a,
                      "std::pair<std::string, std::string> VulkanHppGenerator::generateEnumSuffixes(const std::string &, bool) const"
                     );
      }
      std::__cxx11::string::string((string *)&shortenedName,name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&shortenedName,__pos,8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"",(allocator<char> *)&local_70);
      findTag(&tag,this,&shortenedName,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      stripPostfix(&local_50,&shortenedName,&tag);
      toUpperCase(&local_70,&local_50);
      std::operator+(&local_b0,&local_70,"_");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&prefix,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&tag);
    }
    else {
      toUpperCase(&tag,name);
      std::operator+(&shortenedName,&tag,"_");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&prefix,&shortenedName);
      std::__cxx11::string::~string((string *)&shortenedName);
      this_00 = &tag;
    }
    std::__cxx11::string::~string((string *)this_00);
    for (p_Var2 = (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      __lhs = p_Var2 + 1;
      std::operator+(&shortenedName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,"_")
      ;
      __x._M_str = shortenedName._M_dataplus._M_p;
      __x._M_len = shortenedName._M_string_length;
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              ends_with(&prefix,__x);
      std::__cxx11::string::~string((string *)&shortenedName);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&prefix,~(ulong)p_Var2[1]._M_parent + prefix._M_string_length,0xffffffffffffffff)
        ;
        std::operator+(&shortenedName,"_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
LAB_0014db9d:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&postfix,&shortenedName);
        std::__cxx11::string::~string((string *)&shortenedName);
        break;
      }
      __x_00._M_str = *(char **)__lhs;
      __x_00._M_len = (size_t)p_Var2[1]._M_parent;
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              ends_with(name,__x_00);
      if (bVar1) {
        std::operator+(&shortenedName,"_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
        goto LAB_0014db9d;
      }
    }
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (__return_storage_ptr__,&prefix,&postfix);
  std::__cxx11::string::~string((string *)&postfix);
  std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> VulkanHppGenerator::generateEnumSuffixes( std::string const & name, bool bitmask ) const
{
  std::string prefix, postfix;
  if ( name == "VkResult" )
  {
    prefix = "VK_";
  }
  else
  {
    if ( bitmask )
    {
      // for a bitmask enum, start with "VK", cut off the trailing "FlagBits", and convert that name to upper case
      // end that with "Bit"
      const size_t pos = name.find( "FlagBits" );
      assert( pos != std::string::npos );
      std::string shortenedName = name;
      shortenedName.erase( pos, strlen( "FlagBits" ) );
      std::string tag = findTag( shortenedName );
      prefix          = toUpperCase( stripPostfix( shortenedName, tag ) ) + "_";
    }
    else
    {
      // for a non-bitmask enum, convert the name to upper case
      prefix = toUpperCase( name ) + "_";
    }

    // if the enum name contains a tag move it from the prefix to the postfix to generate correct enum value
    // names.
    for ( auto const & tag : m_tags )
    {
      if ( prefix.ends_with( tag.first + "_" ) )
      {
        prefix.erase( prefix.length() - tag.first.length() - 1 );
        postfix = "_" + tag.first;
        break;
      }
      else if ( name.ends_with( tag.first ) )
      {
        postfix = "_" + tag.first;
        break;
      }
    }
  }

  return { prefix, postfix };
}